

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

bool __thiscall wasm::EffectAnalyzer::hasNonTrapSideEffects(EffectAnalyzer *this)

{
  bool bVar1;
  size_type sVar2;
  byte local_11;
  EffectAnalyzer *this_local;
  
  sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                    (&this->localsWritten);
  local_11 = 1;
  if ((sVar2 == 0) && (local_11 = 1, (this->danglingPop & 1U) == 0)) {
    bVar1 = writesGlobalState(this);
    local_11 = 1;
    if (!bVar1) {
      bVar1 = throws(this);
      local_11 = 1;
      if (!bVar1) {
        bVar1 = transfersControlFlow(this);
        local_11 = 1;
        if (!bVar1) {
          local_11 = this->mayNotReturn;
        }
      }
    }
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool hasNonTrapSideEffects() const {
    return localsWritten.size() > 0 || danglingPop || writesGlobalState() ||
           throws() || transfersControlFlow() || mayNotReturn;
  }